

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_reduce_(void *sendbuf,void *recvbuf,MPIABI_Fint *count,MPIABI_Fint *datatype,
                   MPIABI_Fint *op,MPIABI_Fint *root,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  MPIABI_Fint *root_local;
  MPIABI_Fint *op_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *count_local;
  void *recvbuf_local;
  void *sendbuf_local;
  
  mpi_reduce_(sendbuf,recvbuf,count,datatype,op,root,comm,ierror);
  return;
}

Assistant:

void mpiabi_reduce_(
  const void * sendbuf,
  void * recvbuf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * op,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_reduce_(
    sendbuf,
    recvbuf,
    count,
    datatype,
    op,
    root,
    comm,
    ierror
  );
}